

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundles.c
# Opt level: O0

void Curl_bundle_destroy(connectbundle *cb_ptr)

{
  connectbundle *cb_ptr_local;
  
  if (cb_ptr != (connectbundle *)0x0) {
    if (cb_ptr->conn_list != (curl_llist *)0x0) {
      Curl_llist_destroy(cb_ptr->conn_list,(void *)0x0);
      cb_ptr->conn_list = (curl_llist *)0x0;
    }
    if (cb_ptr != (connectbundle *)0x0) {
      (*Curl_cfree)(cb_ptr);
    }
  }
  return;
}

Assistant:

void Curl_bundle_destroy(struct connectbundle *cb_ptr)
{
  if(!cb_ptr)
    return;

  if(cb_ptr->conn_list) {
    Curl_llist_destroy(cb_ptr->conn_list, NULL);
    cb_ptr->conn_list = NULL;
  }
  Curl_safefree(cb_ptr);
}